

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O2

void miniros::serialization::
     Serializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
     write<miniros::serialization::OStream>(OStream *stream,StringType *str)

{
  ulong __n;
  uint8_t *__dest;
  uint8_t *puVar1;
  
  __n = str->_M_string_length;
  Serializer<unsigned_int>::write<miniros::serialization::OStream>(stream,(uint32_t)__n);
  if (__n != 0) {
    __dest = (stream->super_Stream).data_;
    puVar1 = __dest + (__n & 0xffffffff);
    (stream->super_Stream).data_ = puVar1;
    if ((stream->super_Stream).end_ < puVar1) {
      miniros::serialization::throwStreamOverrun();
    }
    memcpy(__dest,(str->_M_dataplus)._M_p,__n);
    return;
  }
  return;
}

Assistant:

inline static void write(Stream& stream, const StringType& str)
  {
    size_t len = str.size();
    stream.next(static_cast<uint32_t>(len));

    if (len > 0)
    {
      memcpy(stream.advance(static_cast<uint32_t>(len)), str.data(), len);
    }
  }